

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O2

int Test_SUNMatCopy(SUNMatrix A,int myid)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  SUNMatrix A_00;
  
  A_00 = (SUNMatrix)SUNMatClone();
  uVar2 = SUNMatCopy(A,A_00);
  sync_device(A);
  if (uVar2 != 0) {
    iVar3 = 1;
    if (print_all_ranks != 0 || myid != 0) {
      if (print_all_ranks == 0) goto LAB_00101f43;
      printf("process %06d: ",myid);
    }
    printf(">>> FAILED test -- SUNMatCopy returned %d \n",(ulong)uVar2);
    goto LAB_00101f43;
  }
  iVar3 = check_matrix(A_00,A,2.220446049250313e-15);
  if (iVar3 == 0) {
    if (print_all_ranks == 0 && myid == 0) {
LAB_00101f16:
      puts("    PASSED test -- SUNMatCopy ");
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",myid);
      goto LAB_00101f16;
    }
    iVar3 = 0;
    iVar1 = 0;
    if (myid != 0) goto LAB_00101f43;
  }
  else {
    if (print_all_ranks == 0 && myid == 0) {
LAB_00101eea:
      puts(">>> FAILED test -- SUNMatCopy ");
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",myid);
      goto LAB_00101eea;
    }
    iVar1 = 1;
  }
  iVar3 = iVar1;
  if (print_time != 0) {
    printf("    SUNMatCopy Time: %22.15e \n \n",0);
  }
LAB_00101f43:
  SUNMatDestroy(A_00);
  return iVar3;
}

Assistant:

int Test_SUNMatCopy(SUNMatrix A, int myid)
{
  int failure;
  double start_time, stop_time;
  SUNMatrix B;
  sunrealtype tol = 10 * SUN_UNIT_ROUNDOFF;

  B = SUNMatClone(A);

  /* copy matrix data */
  start_time = get_time();
  failure    = SUNMatCopy(A, B);
  sync_device(A);
  stop_time = get_time();

  if (failure)
  {
    TEST_STATUS2(">>> FAILED test -- SUNMatCopy returned %d \n", failure, myid);
    SUNMatDestroy(B);
    return (1);
  }

  /* check matrix entries */
  failure = check_matrix(B, A, tol);

  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatCopy \n", myid);
    PRINT_TIME("    SUNMatCopy Time: %22.15e \n \n", stop_time - start_time);
    SUNMatDestroy(B);
    return (1);
  }
  else { TEST_STATUS("    PASSED test -- SUNMatCopy \n", myid); }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatCopy Time: %22.15e \n \n", stop_time - start_time);
  }

  SUNMatDestroy(B);
  return (0);
}